

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O2

void __thiscall
cppcms::impl::cgi::fastcgi::on_header_read(fastcgi *this,error_code *e,size_t param_2,handler *h)

{
  uint16_t *puVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  ushort uVar5;
  on_header_read_binder *this_00;
  size_t n;
  int local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&)>::operator()(h,e);
    return;
  }
  puVar1 = &(this->header_).request_id;
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  uVar5 = (this->header_).content_length;
  uVar5 = uVar5 << 8 | uVar5 >> 8;
  (this->header_).content_length = uVar5;
  n = (ulong)(this->header_).padding_length + (ulong)uVar5;
  if (n == 0) {
    local_48 = 0;
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::_V2::system_category();
    booster::callback<void_(const_std::error_code_&)>::operator()
              (h,(error_code *)&stack0xffffffffffffffb8);
  }
  else {
    pcVar2 = (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar3 = (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (&this->body_,(size_type)(pcVar2 + (n - (long)pcVar3)));
    this_00 = (on_header_read_binder *)operator_new(0x28);
    self((fastcgi *)&stack0xffffffffffffffb8);
    on_header_read_binder::on_header_read_binder
              (this_00,h,(shared_ptr<cppcms::impl::cgi::fastcgi> *)&stack0xffffffffffffffb8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffc0);
    pcVar4 = (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
    booster::callback<void(std::error_code_const&,unsigned_long)>::
    callback<booster::callable<void(std::error_code_const&,unsigned_long)>>
              ((callback<void(std::error_code_const&,unsigned_long)> *)&stack0xffffffffffffffb8,
               (unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
                *)&stack0xffffffffffffffc8);
    async_read_from_socket
              (this,pcVar2 + ((long)pcVar4 - (long)pcVar3),n,(io_handler *)&stack0xffffffffffffffb8)
    ;
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr((intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                    *)&stack0xffffffffffffffb8);
    if ((on_header_read_binder *)local_38._M_pi != (on_header_read_binder *)0x0) {
      (*(((callable<void_(const_std::error_code_&,_unsigned_long)> *)
         &(local_38._M_pi)->_vptr__Sp_counted_base)->super_refcounted)._vptr_refcounted[1])();
    }
  }
  return;
}

Assistant:

void on_header_read(booster::system::error_code const &e,size_t /*unused read*/,handler const &h)
		{
			if(e) { h(e); return; }
			header_.to_host();
			size_t cur_size=body_.size();
			size_t rec_size=header_.content_length+header_.padding_length;
			if(rec_size==0) {
				h(booster::system::error_code());
				return;
			}
			body_.resize(cur_size + rec_size);
			std::unique_ptr<booster::callable<void(booster::system::error_code const &,size_t)> > cb;
			cb.reset(new on_header_read_binder(h,self()));
			async_read_from_socket(
				&body_[cur_size],rec_size,
				std::move(cb));
		}